

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

void __thiscall
cmOutputConverter::cmOutputConverter(cmOutputConverter *this,cmStateSnapshot *snapshot)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  bool bVar2;
  cmStateSnapshot *snapshot_local;
  cmOutputConverter *this_local;
  
  (this->StateSnapshot).Position.Position = (snapshot->Position).Position;
  pcVar1 = (snapshot->Position).Tree;
  (this->StateSnapshot).State = snapshot->State;
  (this->StateSnapshot).Position.Tree = pcVar1;
  this->LinkScriptShell = false;
  std::__cxx11::string::string((string *)&this->RelativePathTopSource);
  std::__cxx11::string::string((string *)&this->RelativePathTopBinary);
  this->RelativePathTopRelation = Separate;
  bVar2 = cmStateSnapshot::IsValid(&this->StateSnapshot);
  if (!bVar2) {
    __assert_fail("this->StateSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmOutputConverter.cxx"
                  ,0x21,"cmOutputConverter::cmOutputConverter(const cmStateSnapshot &)");
  }
  ComputeRelativePathTopSource(this);
  ComputeRelativePathTopBinary(this);
  ComputeRelativePathTopRelation(this);
  return;
}

Assistant:

cmOutputConverter::cmOutputConverter(cmStateSnapshot const& snapshot)
  : StateSnapshot(snapshot)
{
  assert(this->StateSnapshot.IsValid());
  this->ComputeRelativePathTopSource();
  this->ComputeRelativePathTopBinary();
  this->ComputeRelativePathTopRelation();
}